

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O3

Link * __thiscall Link::find(Link *this,string *s)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  
  __s2 = (s->_M_dataplus)._M_p;
  __n = s->_M_string_length;
  do {
    if ((this->value)._M_string_length == __n) {
      if (__n == 0) {
        return this;
      }
      iVar1 = bcmp((this->value)._M_dataplus._M_p,__s2,__n);
      if (iVar1 == 0) {
        return this;
      }
    }
    this = this->succ;
    if (this == (Link *)0x0) {
      return (Link *)0x0;
    }
  } while( true );
}

Assistant:

Link* Link::find(const std::string& s)
{
	Link* p = this;
	while (p)
	{
		if (p->value == s)
			return p;
		p = p->succ;
	}
	return nullptr;
}